

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisketch_tests.cpp
# Opt level: O3

void __thiscall minisketch_tests::minisketch_test::test_method(minisketch_test *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Minisketch sketch;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  uint64_t max_elements;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint uVar12;
  FastRandomContext *this_00;
  ulong uVar13;
  undefined8 uVar14;
  iterator in_R8;
  iterator in_R9;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint64_t maxval;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  check_type cVar19;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  uint local_16c;
  undefined1 local_168 [16];
  undefined1 *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  Minisketch sketch_c;
  Minisketch sketch_br;
  Minisketch sketch_ar;
  Minisketch sketch_b;
  Minisketch sketch_a;
  uint *local_d0;
  assertion_result local_c8;
  uint **local_b0;
  ulong *local_a8;
  lazy_ostream local_a0;
  undefined1 *local_90;
  ulong **local_88;
  char *local_80;
  char *local_78;
  assertion_result local_70;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> dec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  iVar17 = 0;
  do {
    do {
      max_elements = RandomMixin<FastRandomContext>::randbits
                               (&this_00->super_RandomMixin<FastRandomContext>,4);
    } while (10 < max_elements);
    do {
      uVar9 = RandomMixin<FastRandomContext>::randbits
                        (&this_00->super_RandomMixin<FastRandomContext>,0x1e);
    } while (999999999 < uVar9);
    uVar18 = (uint)max_elements;
    if (uVar18 == 0) {
      uVar8 = 0x20;
    }
    else {
      uVar8 = 0x1f;
      if (uVar18 != 0) {
        for (; uVar18 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = uVar8 ^ 0x1f;
    }
    do {
      uVar10 = RandomMixin<FastRandomContext>::randbits
                         (&this_00->super_RandomMixin<FastRandomContext>,0x20 - uVar8);
    } while (max_elements < uVar10);
    do {
      uVar11 = RandomMixin<FastRandomContext>::randbits
                         (&this_00->super_RandomMixin<FastRandomContext>,0xe);
    } while (9999 < uVar11);
    iVar3 = (int)uVar9;
    uVar12 = iVar3 + 1;
    iVar4 = (int)uVar10;
    uVar8 = iVar3 + iVar4 + 1;
    uVar13 = (ulong)uVar8;
    iVar5 = (int)uVar11;
    ::node::MakeMinisketch32((node *)&sketch_a,10);
    if (uVar12 < uVar8 + iVar5) {
      uVar9 = (uint64_t)uVar12;
      iVar15 = iVar4 + iVar5;
      do {
        minisketch_add_uint64
                  ((minisketch *)
                   sketch_a.m_minisketch._M_t.super___uniq_ptr_impl<minisketch,_Minisketch::Deleter>
                   ._M_t.super__Tuple_impl<0UL,_minisketch_*,_Minisketch::Deleter>.
                   super__Head_base<0UL,_minisketch_*,_false>._M_head_impl,uVar9);
        uVar9 = uVar9 + 1;
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
    }
    ::node::MakeMinisketch32((node *)&sketch_b,10);
    iVar15 = uVar18 - iVar4;
    if (uVar8 < uVar8 + iVar5 + iVar15) {
      iVar16 = iVar15 + iVar5;
      do {
        minisketch_add_uint64
                  ((minisketch *)
                   sketch_b.m_minisketch._M_t.super___uniq_ptr_impl<minisketch,_Minisketch::Deleter>
                   ._M_t.super__Tuple_impl<0UL,_minisketch_*,_Minisketch::Deleter>.
                   super__Head_base<0UL,_minisketch_*,_false>._M_head_impl,uVar13);
        uVar13 = uVar13 + 1;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
    }
    ::node::MakeMinisketch32((node *)&sketch_ar,10);
    ::node::MakeMinisketch32((node *)&sketch_br,10);
    Minisketch::Serialize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,&sketch_a);
    Minisketch::Deserialize<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              (&sketch_ar,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,
               (type)0x0);
    if (local_a0._vptr_lazy_ostream != (_func_int **)0x0) {
      operator_delete(local_a0._vptr_lazy_ostream,(long)local_90 - (long)local_a0._vptr_lazy_ostream
                     );
    }
    Minisketch::Serialize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,&sketch_b);
    Minisketch::Deserialize<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              (&sketch_br,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,
               (type)0x0);
    if (local_a0._vptr_lazy_ostream != (_func_int **)0x0) {
      operator_delete(local_a0._vptr_lazy_ostream,(long)local_90 - (long)local_a0._vptr_lazy_ostream
                     );
    }
    sketch.m_minisketch._M_t.super___uniq_ptr_impl<minisketch,_Minisketch::Deleter>._M_t.
    super__Tuple_impl<0UL,_minisketch_*,_Minisketch::Deleter>.
    super__Head_base<0UL,_minisketch_*,_false>._M_head_impl =
         sketch_ar.m_minisketch._M_t.super___uniq_ptr_impl<minisketch,_Minisketch::Deleter>._M_t.
         super__Tuple_impl<0UL,_minisketch_*,_Minisketch::Deleter>.
         super__Head_base<0UL,_minisketch_*,_false>._M_head_impl;
    sketch_c = sketch_ar;
    sketch_ar.m_minisketch._M_t.super___uniq_ptr_impl<minisketch,_Minisketch::Deleter>._M_t.
    super__Tuple_impl<0UL,_minisketch_*,_Minisketch::Deleter>.
    super__Head_base<0UL,_minisketch_*,_false>._M_head_impl =
         (unique_ptr<minisketch,_Minisketch::Deleter>)
         (__uniq_ptr_data<minisketch,_Minisketch::Deleter,_true,_true>)0x0;
    minisketch_merge((minisketch *)
                     sketch.m_minisketch._M_t.super___uniq_ptr_impl<minisketch,_Minisketch::Deleter>
                     ._M_t.super__Tuple_impl<0UL,_minisketch_*,_Minisketch::Deleter>.
                     super__Head_base<0UL,_minisketch_*,_false>._M_head_impl,
                     (minisketch *)
                     sketch_br.m_minisketch._M_t.
                     super___uniq_ptr_impl<minisketch,_Minisketch::Deleter>._M_t.
                     super__Tuple_impl<0UL,_minisketch_*,_Minisketch::Deleter>.
                     super__Head_base<0UL,_minisketch_*,_false>._M_head_impl);
    Minisketch::Decode(&dec,&sketch_c,max_elements);
    local_108 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/minisketch_tests.cpp"
    ;
    local_100 = "";
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar19 = 0x495d8e;
    file.m_end = (iterator)0x2c;
    file.m_begin = (iterator)&local_108;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
    local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         dec.
         super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
         .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
         _M_engaged;
    local_c8.m_message.px = (element_type *)0x0;
    local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_168._0_8_ = "dec.has_value()";
    local_168._8_8_ = "";
    local_a0.m_empty = false;
    local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_90 = boost::unit_test::lazy_ostream::inst;
    local_88 = (ulong **)local_168;
    local_128 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/minisketch_tests.cpp"
    ;
    local_120 = "";
    in_R8 = (iterator)0x2;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_c8,&local_a0,2,0,WARN,_cVar19,(size_t)&local_128,0x2c);
    boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
    uVar7 = dec.
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    uVar14 = dec.
             super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar6 = dec.
            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
    dec.
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    dec.
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    dec.
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (uVar6 != uVar14) {
      uVar13 = (long)(uVar14 - uVar6) >> 3;
      lVar2 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (uVar6,uVar14,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (uVar6,uVar14);
    }
    if (uVar10 != 0) {
      uVar13 = (ulong)(iVar4 + (uint)(iVar4 == 0));
      uVar14 = uVar6;
      do {
        local_138 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/minisketch_tests.cpp"
        ;
        local_130 = "";
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        local_140 = &boost::unit_test::basic_cstring<char_const>::null;
        file_00.m_end = (iterator)0x2f;
        file_00.m_begin = (iterator)&local_138;
        msg_00.m_end = in_R9;
        msg_00.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_148
                   ,msg_00);
        local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
        local_168._0_8_ = &PTR__lazy_ostream_01388f08;
        local_158 = boost::unit_test::lazy_ostream::inst;
        local_150 = "";
        local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(*(ulong *)uVar14 == (ulong)uVar12);
        local_70.m_message.px = (element_type *)0x0;
        local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_80 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/minisketch_tests.cpp"
        ;
        local_78 = "";
        local_a0.m_empty = false;
        local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f48;
        local_90 = boost::unit_test::lazy_ostream::inst;
        local_88 = &local_a8;
        local_d0 = &local_16c;
        local_c8.m_message.px = (element_type *)((ulong)local_c8.m_message.px & 0xffffffffffffff00);
        local_c8._0_8_ = &PTR__lazy_ostream_01388f88;
        local_c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_b0 = &local_d0;
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x2;
        local_16c = uVar12;
        local_a8 = (ulong *)uVar14;
        boost::test_tools::tt_detail::report_assertion
                  (&local_70,(lazy_ostream *)local_168,1,2,REQUIRE,0xe8ac0c,(size_t)&local_80,0x2f,
                   &local_a0,"start_a + i",&local_c8);
        boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
        uVar14 = uVar14 + 8;
        uVar12 = uVar12 + 1;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    if (max_elements == uVar10) {
      if ((pointer)uVar6 != (pointer)0x0) goto LAB_0049623f;
    }
    else {
      uVar13 = (ulong)(iVar15 + (uint)(iVar15 == 0));
      do {
        local_180 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/minisketch_tests.cpp"
        ;
        local_178 = "";
        local_190 = &boost::unit_test::basic_cstring<char_const>::null;
        local_188 = &boost::unit_test::basic_cstring<char_const>::null;
        file_01.m_end = (iterator)0x30;
        file_01.m_begin = (iterator)&local_180;
        msg_01.m_end = in_R9;
        msg_01.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_190
                   ,msg_01);
        local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
        local_168._0_8_ = &PTR__lazy_ostream_01388f08;
        local_158 = boost::unit_test::lazy_ostream::inst;
        local_150 = "";
        local_a8 = (ulong *)(uVar6 + (uVar10 & 0xffffffff) * 8);
        local_16c = iVar3 + iVar5 + 1 + (int)uVar10;
        local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(*local_a8 == (ulong)local_16c);
        local_70.m_message.px = (element_type *)0x0;
        local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_80 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/minisketch_tests.cpp"
        ;
        local_78 = "";
        local_a0.m_empty = false;
        local_a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f48;
        local_90 = boost::unit_test::lazy_ostream::inst;
        local_88 = &local_a8;
        local_d0 = &local_16c;
        local_c8.m_message.px = (element_type *)((ulong)local_c8.m_message.px & 0xffffffffffffff00);
        local_c8._0_8_ = &PTR__lazy_ostream_01388f88;
        local_c8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_b0 = &local_d0;
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  (&local_70,(lazy_ostream *)local_168,1,2,REQUIRE,0xe8ac20,(size_t)&local_80,0x30,
                   &local_a0,"start_b + both + i",&local_c8);
        boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
        uVar10 = uVar10 + 1;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
LAB_0049623f:
      operator_delete((void *)uVar6,uVar7 - uVar6);
    }
    if ((dec.
         super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
         .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
         _M_engaged == true) &&
       (dec.
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_engaged = false,
       dec.
       super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
       .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
       _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(dec.
                      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ._M_payload._M_value.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)dec.
                            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._M_payload._M_value.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      dec.
                      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ._M_payload._0_8_);
    }
    std::unique_ptr<minisketch,_Minisketch::Deleter>::~unique_ptr(&sketch_c.m_minisketch);
    std::unique_ptr<minisketch,_Minisketch::Deleter>::~unique_ptr(&sketch_br.m_minisketch);
    std::unique_ptr<minisketch,_Minisketch::Deleter>::~unique_ptr(&sketch_ar.m_minisketch);
    std::unique_ptr<minisketch,_Minisketch::Deleter>::~unique_ptr(&sketch_b.m_minisketch);
    std::unique_ptr<minisketch,_Minisketch::Deleter>::~unique_ptr(&sketch_a.m_minisketch);
    iVar17 = iVar17 + 1;
    if (iVar17 == 100) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(minisketch_test)
{
    for (int i = 0; i < 100; ++i) {
        uint32_t errors = 0 + m_rng.randrange(11);
        uint32_t start_a = 1 + m_rng.randrange(1000000000);
        uint32_t a_not_b = m_rng.randrange(errors + 1);
        uint32_t b_not_a = errors - a_not_b;
        uint32_t both = m_rng.randrange(10000);
        uint32_t end_a = start_a + a_not_b + both;
        uint32_t start_b = start_a + a_not_b;
        uint32_t end_b = start_b + both + b_not_a;

        Minisketch sketch_a = MakeMinisketch32(10);
        for (uint32_t a = start_a; a < end_a; ++a) sketch_a.Add(a);
        Minisketch sketch_b = MakeMinisketch32(10);
        for (uint32_t b = start_b; b < end_b; ++b) sketch_b.Add(b);

        Minisketch sketch_ar = MakeMinisketch32(10);
        Minisketch sketch_br = MakeMinisketch32(10);
        sketch_ar.Deserialize(sketch_a.Serialize());
        sketch_br.Deserialize(sketch_b.Serialize());

        Minisketch sketch_c = std::move(sketch_ar);
        sketch_c.Merge(sketch_br);
        auto dec = sketch_c.Decode(errors);
        BOOST_REQUIRE(dec.has_value());
        auto sols = std::move(*dec);
        std::sort(sols.begin(), sols.end());
        for (uint32_t i = 0; i < a_not_b; ++i) BOOST_CHECK_EQUAL(sols[i], start_a + i);
        for (uint32_t i = 0; i < b_not_a; ++i) BOOST_CHECK_EQUAL(sols[i + a_not_b], start_b + both + i);
    }
}